

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

void __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::clear(hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
        *this)

{
  _Hashtable_node<int> *p_Var1;
  _Node *p_Var2;
  reference pp_Var3;
  _Node *__next;
  _Node *__cur;
  size_type __i;
  hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
  *this_local;
  
  __cur = (_Node *)0x0;
  while( true ) {
    p_Var2 = (_Node *)std::
                      vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                      ::size(&this->_M_buckets);
    if (p_Var2 <= __cur) break;
    pp_Var3 = std::
              vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
              ::operator[](&this->_M_buckets,(size_type)__cur);
    __next = *pp_Var3;
    while (__next != (_Node *)0x0) {
      p_Var1 = __next->_M_next;
      _M_delete_node(this,__next);
      __next = p_Var1;
    }
    pp_Var3 = std::
              vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
              ::operator[](&this->_M_buckets,(size_type)__cur);
    *pp_Var3 = (value_type)0x0;
    __cur = (_Node *)((long)&__cur->_M_next + 1);
  }
  this->_M_num_elements = 0;
  return;
}

Assistant:

void hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::clear()
{
  for (size_type __i = 0; __i < _M_buckets.size(); ++__i) {
    _Node* __cur = _M_buckets[__i];
    while (__cur != 0) {
      _Node* __next = __cur->_M_next;
      _M_delete_node(__cur);
      __cur = __next;
    }
    _M_buckets[__i] = 0;
  }
  _M_num_elements = 0;
}